

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenLookupByKey
          (string *__return_storage_ptr__,KotlinKMPGenerator *this,FieldDef *key_field,
          string *bb_var_name,char *num)

{
  string local_108;
  string local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 auStack_58 [8];
  Type type;
  char *num_local;
  string *bb_var_name_local;
  FieldDef *key_field_local;
  KotlinKMPGenerator *this_local;
  
  auStack_58._0_4_ = (key_field->value).type.base_type;
  auStack_58._4_4_ = (key_field->value).type.element;
  type._0_8_ = (key_field->value).type.struct_def;
  type.struct_def = (StructDef *)(key_field->value).type.enum_def;
  type.enum_def = *(EnumDef **)&(key_field->value).type.fixed_length;
  std::__cxx11::string::string((string *)&local_d8,(string *)bb_var_name);
  ByteBufferGetter(&local_b8,this,(Type *)auStack_58,&local_d8);
  std::operator+(&local_98,&local_b8,"(");
  GenOffsetGetter_abi_cxx11_(&local_108,this,key_field,num);
  std::operator+(&local_78,&local_98,&local_108);
  std::operator+(__return_storage_ptr__,&local_78,")");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  return __return_storage_ptr__;
}

Assistant:

std::string GenLookupByKey(flatbuffers::FieldDef *key_field,
                             const std::string &bb_var_name,
                             const char *num = nullptr) const {
    auto type = key_field->value.type;
    return ByteBufferGetter(type, bb_var_name) + "(" +
           GenOffsetGetter(key_field, num) + ")";
  }